

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int iso9660_write_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  mode_t mVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uchar *p;
  la_int64_t lVar9;
  isofile *file;
  char *pcVar10;
  archive_rb_node *paVar11;
  ulong uVar12;
  void *pvVar13;
  int *piVar14;
  byte bVar15;
  size_t size;
  isoent *isoent;
  
  pvVar2 = a->format_data;
  *(undefined8 *)((long)pvVar2 + 0x10) = 0;
  *(undefined8 *)((long)pvVar2 + 0x38) = 0;
  *(undefined4 *)((long)pvVar2 + 0x40) = 0;
  mVar4 = archive_entry_filetype(entry);
  if ((mVar4 == 0xa000) && ((*(ushort *)((long)pvVar2 + 0x10372) & 0x180) == 0)) {
    archive_set_error(&a->archive,-1,"Ignore symlink file.");
LAB_00369eb6:
    *(undefined8 *)((long)pvVar2 + 0x10) = 0;
    return -0x14;
  }
  mVar4 = archive_entry_filetype(entry);
  if ((mVar4 == 0x8000) && (lVar9 = archive_entry_size(entry), 0xffffffff < lVar9)) {
    if ((*(uint *)((long)pvVar2 + 0x10370) & 0x1c000) < 0xc000) {
      archive_set_error(&a->archive,-1,"Ignore over %lld bytes file. This file too large.");
      goto LAB_00369eb6;
    }
    *(undefined4 *)((long)pvVar2 + 0x40) = 1;
  }
  file = isofile_new(a,entry);
  if (file == (isofile *)0x0) {
LAB_0036a00b:
    pcVar10 = "Can\'t allocate data";
  }
  else {
    iVar5 = isofile_gen_utility_names(a,file);
    if ((iVar5 < -0x14) || (((file->parentdir).length == 0 && ((file->basename).length == 0)))) {
      isofile_free(file);
      return iVar5;
    }
    file->allnext = (isofile *)0x0;
    **(undefined8 **)((long)pvVar2 + 0x90) = file;
    *(isofile **)((long)pvVar2 + 0x90) = file;
    isoent = isoent_new(file);
    if (isoent == (isoent *)0x0) goto LAB_0036a00b;
    iVar6 = isoent->file->dircnt;
    if (*(int *)((long)pvVar2 + 0x2d8) < iVar6) {
      *(int *)((long)pvVar2 + 0x2d8) = iVar6;
    }
    iVar6 = isoent_tree(a,&isoent);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (isoent->file != file) {
      return 0;
    }
    mVar4 = archive_entry_filetype(file->entry);
    if (mVar4 != 0x8000) {
      return iVar5;
    }
    *(isofile **)((long)pvVar2 + 0x10) = file;
    uVar7 = archive_entry_nlink(file->entry);
    if (uVar7 < 2) {
LAB_0036a06c:
      if (*(int *)((long)pvVar2 + 8) < 0) {
        iVar6 = __archive_mktemp((char *)0x0);
        *(int *)((long)pvVar2 + 8) = iVar6;
        if (iVar6 < 0) {
          piVar14 = __errno_location();
          iVar5 = *piVar14;
          pcVar10 = "Couldn\'t create temporary file";
          goto LAB_0036a015;
        }
      }
      pvVar3 = a->format_data;
      (file->content).offset_of_temp =
           (*(long *)((long)pvVar3 + 0x102f0) - *(long *)((long)pvVar3 + 0x102e0)) + 0x10000;
      file->cur_content = &file->content;
      *(byte *)((long)pvVar3 + 0x1d8) = *(byte *)((long)pvVar3 + 0x1d8) & 0xfc;
      iVar6 = 0;
      if ((*(uint *)((long)pvVar3 + 0x10370) >> 0x1a & 1) != 0 &&
          (*(uint *)((long)pvVar3 + 0x10370) & 0x1800000) != 0) {
        lVar9 = archive_entry_size(file->entry);
        if (lVar9 < 0x18) {
          bVar15 = *(byte *)((long)pvVar3 + 0x1d8);
        }
        else {
          lVar9 = archive_entry_size(file->entry);
          bVar15 = *(byte *)((long)pvVar3 + 0x1d8);
          if (lVar9 < 0x100000000) {
            bVar15 = bVar15 | 1;
            *(byte *)((long)pvVar3 + 0x1d8) = bVar15;
            *(undefined4 *)((long)pvVar3 + 0x21c) = 0;
          }
        }
        if (((bVar15 & 1) != 0) && (lVar9 = archive_entry_size(file->entry), 0x800 < lVar9)) {
          iVar8 = zisofs_init_zstream(a);
          iVar6 = -0x1e;
          if (iVar8 == 0) {
            (file->zisofs).header_size = '\x04';
            (file->zisofs).log2_bs = '\x0f';
            uVar12 = archive_entry_size(file->entry);
            (file->zisofs).uncompressed_size = (uint32_t)uVar12;
            iVar8 = (int)((uVar12 & 0xffffffff) + 0x7fff >> ((file->zisofs).log2_bs & 0x3f));
            *(int *)((long)pvVar3 + 0x230) = iVar8 + 1;
            *(undefined4 *)((long)pvVar3 + 0x234) = 0;
            lVar1 = (long)iVar8 * 4;
            uVar12 = lVar1 + 4;
            if (*(ulong *)((long)pvVar3 + 0x228) < uVar12) {
              free(*(void **)((long)pvVar3 + 0x220));
              pvVar13 = malloc(uVar12);
              *(void **)((long)pvVar3 + 0x220) = pvVar13;
              if (pvVar13 == (void *)0x0) {
                archive_set_error(&a->archive,0xc,"Can\'t allocate data");
                goto LAB_0036a265;
              }
              *(ulong *)((long)pvVar3 + 0x228) = uVar12;
            }
            size = lVar1 + 0x14;
            iVar8 = write_null(a,size);
            if (iVar8 == 0) {
              **(undefined4 **)((long)pvVar3 + 0x220) = (int)size;
              *(ulong *)((long)pvVar3 + 0x2c0) = (ulong)(file->zisofs).uncompressed_size;
              *(byte *)((long)pvVar3 + 0x1d8) = *(byte *)((long)pvVar3 + 0x1d8) | 6;
              *(size_t *)((long)pvVar3 + 0x240) = size;
              *(size_t *)((long)pvVar3 + 0x238) = size;
              *(size_t *)(*(long *)(*(long *)((long)pvVar3 + 0x10) + 0xb0) + 8) = size;
              iVar6 = 0;
            }
          }
        }
      }
LAB_0036a265:
      if (iVar6 < iVar5) {
        iVar5 = iVar6;
      }
      lVar9 = archive_entry_size(file->entry);
      *(la_int64_t *)((long)pvVar2 + 0x38) = lVar9;
      return iVar5;
    }
    pvVar3 = a->format_data;
    archive_entry_set_nlink(file->entry,1);
    pcVar10 = archive_entry_hardlink(file->entry);
    if (pcVar10 != (char *)0x0) {
      paVar11 = __archive_rb_tree_find_node((archive_rb_tree *)((long)pvVar3 + 0xa8),pcVar10);
      if (paVar11 != (archive_rb_node *)0x0) {
        file->hlnext = (isofile *)0x0;
        *(isofile **)paVar11[1].rb_info = file;
        paVar11[1].rb_info = (uintptr_t)&file->hlnext;
        *(int *)paVar11[1].rb_nodes = *(int *)paVar11[1].rb_nodes + 1;
      }
      archive_entry_unset_size(file->entry);
      goto LAB_0036a06c;
    }
    paVar11 = (archive_rb_node *)malloc(0x30);
    if (paVar11 != (archive_rb_node *)0x0) {
      *(undefined4 *)paVar11[1].rb_nodes = 1;
      file->hlnext = (isofile *)0x0;
      paVar11[1].rb_nodes[1] = (archive_rb_node *)file;
      paVar11[1].rb_info = (uintptr_t)&file->hlnext;
      __archive_rb_tree_insert_node((archive_rb_tree *)((long)pvVar3 + 0xa8),paVar11);
      goto LAB_0036a06c;
    }
    pcVar10 = "Can\'t allocate memory";
  }
  iVar5 = 0xc;
LAB_0036a015:
  archive_set_error(&a->archive,iVar5,pcVar10);
  return -0x1e;
}

Assistant:

static int
iso9660_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct isofile *file;
	struct isoent *isoent;
	int r, ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	iso9660->cur_file = NULL;
	iso9660->bytes_remaining = 0;
	iso9660->need_multi_extent = 0;
	if (archive_entry_filetype(entry) == AE_IFLNK
	    && iso9660->opt.rr == OPT_RR_DISABLED) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignore symlink file.");
		iso9660->cur_file = NULL;
		return (ARCHIVE_WARN);
	}
	if (archive_entry_filetype(entry) == AE_IFREG &&
	    archive_entry_size(entry) >= MULTI_EXTENT_SIZE) {
		if (iso9660->opt.iso_level < 3) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Ignore over %lld bytes file. "
			    "This file too large.",
			    MULTI_EXTENT_SIZE);
				iso9660->cur_file = NULL;
			return (ARCHIVE_WARN);
		}
		iso9660->need_multi_extent = 1;
	}

	file = isofile_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r = isofile_gen_utility_names(a, file);
	if (r < ARCHIVE_WARN) {
		isofile_free(file);
		return (r);
	}
	else if (r < ret)
		ret = r;

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an ISO image.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		isofile_free(file);
		return (r);
	}

	isofile_add_entry(iso9660, file);
	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	if (isoent->file->dircnt > iso9660->dircnt_max)
		iso9660->dircnt_max = isoent->file->dircnt;

	/* Add the current file into tree */
	r = isoent_tree(a, &isoent);
	if (r != ARCHIVE_OK)
		return (r);

	/* If there is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (isoent->file != file)
		return (ARCHIVE_OK);

	/* Non regular files contents are unneeded to be saved to
	 * temporary files. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (ret);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	iso9660->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = isofile_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Prepare to save the contents of the file.
	 */
	if (iso9660->temp_fd < 0) {
		iso9660->temp_fd = __archive_mktemp(NULL);
		if (iso9660->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	/* Save an offset of current file in temporary file. */
	file->content.offset_of_temp = wb_offset(a);
	file->cur_content = &(file->content);
	r = zisofs_init(a, file);
	if (r < ret)
		ret = r;
	iso9660->bytes_remaining =  archive_entry_size(file->entry);

	return (ret);
}